

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

string * __thiscall S2CellId::ToString_abi_cxx11_(string *__return_storage_ptr__,S2CellId *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  AlphaNum *in_RCX;
  int level;
  Hex hex;
  AlphaNum AStack_88;
  AlphaNum local_58;
  
  uVar3 = this->id_;
  uVar2 = (uint)(uVar3 >> 0x20);
  if ((2 < uVar2 >> 0x1e) ||
     (in_RCX = (AlphaNum *)(uVar3 & 0x1555555555555555 & -uVar3), in_RCX == (AlphaNum *)0x0)) {
    absl::string_view::string_view(&AStack_88.piece_,"Invalid: ");
    hex.width = '\x10';
    hex.fill = '0';
    hex._10_6_ = 0;
    hex.value = this->id_;
    absl::AlphaNum::AlphaNum(&local_58,hex);
    absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&AStack_88,&local_58,in_RCX);
    return __return_storage_ptr__;
  }
  absl::AlphaNum::AlphaNum(&AStack_88,uVar2 >> 0x1d);
  absl::string_view::string_view(&local_58.piece_,"/");
  absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&AStack_88,&local_58,in_RCX);
  uVar3 = this->id_;
  if (uVar3 != 0) {
    level = 1;
    do {
      uVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      if ((int)(0x1e - ((uint)(uVar1 >> 1) & 0x7fffffff)) < level) {
        return __return_storage_ptr__;
      }
      child_position(this,level);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      level = level + 1;
      uVar3 = this->id_;
    } while (uVar3 != 0);
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&AStack_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
             ,0x223,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)AStack_88.piece_.length_,"Check failed: id_ != 0 ",0x17);
  abort();
}

Assistant:

string S2CellId::ToString() const {
  if (!is_valid()) {
    return StrCat("Invalid: ", absl::Hex(id(), absl::kZeroPad16));
  }
  string out = StrCat(face(), "/");
  for (int current_level = 1; current_level <= level(); ++current_level) {
    // Avoid dependencies of SimpleItoA, and slowness of StrAppend &
    // std::to_string.
    out += "0123"[child_position(current_level)];
  }
  return out;
}